

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_CCtxParams_setParameter
                 (ZSTD_CCtx_params *CCtxParams,ZSTD_cParameter param,int value)

{
  size_t sVar1;
  uint uVar2;
  
  sVar1 = 0xffffffffffffffd8;
  if ((int)param < 0x191) {
    if ((int)param < 0xa0) {
      switch(param) {
      case ZSTD_c_compressionLevel:
        uVar2 = 0xfffe0000;
        if (((-0x20001 < value) && (uVar2 = 0x16, value < 0x17)) && (uVar2 = 3, value != 0)) {
          uVar2 = value;
        }
        CCtxParams->compressionLevel = uVar2;
        sVar1 = 0;
        if (0 < (int)uVar2) {
          sVar1 = (size_t)uVar2;
        }
        return sVar1;
      case ZSTD_c_windowLog:
        if (value != 0 && value - 0x20U < 0xffffffea) {
          return 0xffffffffffffffd6;
        }
        (CCtxParams->cParams).windowLog = value;
        break;
      case ZSTD_c_hashLog:
        if (value != 0 && value - 0x1fU < 0xffffffe7) {
          return 0xffffffffffffffd6;
        }
        (CCtxParams->cParams).hashLog = value;
        break;
      case ZSTD_c_chainLog:
        if (value != 0 && value - 0x1fU < 0xffffffe7) {
          return 0xffffffffffffffd6;
        }
        (CCtxParams->cParams).chainLog = value;
        break;
      case ZSTD_c_searchLog:
        if (0x1e < (uint)value) {
          return 0xffffffffffffffd6;
        }
        (CCtxParams->cParams).searchLog = value;
        break;
      case ZSTD_c_minMatch:
        if ((4 < value - 3U) && (value != 0)) {
          return 0xffffffffffffffd6;
        }
        (CCtxParams->cParams).minMatch = value;
        break;
      case ZSTD_c_targetLength:
        if (0x20000 < (uint)value) {
          return 0xffffffffffffffd6;
        }
        (CCtxParams->cParams).targetLength = value;
        break;
      case ZSTD_c_strategy:
        if (9 < (uint)value) {
          return 0xffffffffffffffd6;
        }
        (CCtxParams->cParams).strategy = value;
        break;
      default:
        if (param != ZSTD_c_experimentalParam2) {
          if (param != ZSTD_c_targetCBlockSize) {
            return 0xffffffffffffffd8;
          }
          if (value == 0) {
            uVar2 = 0;
          }
          else {
            uVar2 = 0x53c;
            if (0x53c < value) {
              uVar2 = value;
            }
            if (0x20000 < value) {
              return 0xffffffffffffffd6;
            }
          }
          CCtxParams->targetCBlockSize = (ulong)uVar2;
          return (ulong)uVar2;
        }
        if (1 < (uint)value) {
          return 0xffffffffffffffd6;
        }
        CCtxParams->format = value;
      }
    }
    else {
      if (199 < (int)param) {
        if ((int)param < 0xca) {
          if (param == ZSTD_c_contentSizeFlag) {
            (CCtxParams->fParams).contentSizeFlag = (uint)(value != 0);
            return (ulong)(value != 0);
          }
          if (param != ZSTD_c_checksumFlag) {
            return 0xffffffffffffffd8;
          }
          (CCtxParams->fParams).checksumFlag = (uint)(value != 0);
          return (ulong)(value != 0);
        }
        if (param == ZSTD_c_dictIDFlag) {
          (CCtxParams->fParams).noDictIDFlag = (uint)(value == 0);
          return (ulong)(value != 0);
        }
        if (param != ZSTD_c_nbWorkers) {
          return 0xffffffffffffffd8;
        }
        goto LAB_018ad1ab;
      }
      switch(param) {
      case ZSTD_c_enableLongDistanceMatching:
        if (2 < (uint)value) {
          return 0xffffffffffffffd6;
        }
        (CCtxParams->ldmParams).enableLdm = value;
        break;
      case ZSTD_c_ldmHashLog:
        if (value != 0 && value - 0x1fU < 0xffffffe7) {
          return 0xffffffffffffffd6;
        }
        (CCtxParams->ldmParams).hashLog = value;
        break;
      case ZSTD_c_ldmMinMatch:
        if (value != 0 && value - 0x1001U < 0xfffff003) {
          return 0xffffffffffffffd6;
        }
        (CCtxParams->ldmParams).minMatchLength = value;
        break;
      case ZSTD_c_ldmBucketSizeLog:
        if (8 < (uint)value) {
          return 0xffffffffffffffd6;
        }
        (CCtxParams->ldmParams).bucketSizeLog = value;
        break;
      case ZSTD_c_ldmHashRateLog:
        if (0x19 < (uint)value) {
          return 0xffffffffffffffd6;
        }
        (CCtxParams->ldmParams).hashRateLog = value;
        break;
      default:
        goto switchD_018ad0ea_default;
      }
    }
  }
  else {
    if ((int)param < 1000) {
      if (((param != ZSTD_c_jobSize) && (param != ZSTD_c_overlapLog)) &&
         (param != ZSTD_c_experimentalParam1)) {
        return 0xffffffffffffffd8;
      }
LAB_018ad1ab:
      if (value == 0) {
        sVar1 = 0;
      }
      return sVar1;
    }
    switch(param) {
    case ZSTD_c_experimentalParam3:
      CCtxParams->forceWindow = (uint)(value != 0);
      return (ulong)(value != 0);
    case ZSTD_c_experimentalParam4:
      if (3 < (uint)value) {
        return 0xffffffffffffffd6;
      }
      CCtxParams->attachDictPref = value;
      break;
    case ZSTD_c_experimentalParam5:
      if (2 < (uint)value) {
        return 0xffffffffffffffd6;
      }
      CCtxParams->literalCompressionMode = value;
      break;
    default:
      goto switchD_018ad0ea_default;
    case ZSTD_c_experimentalParam7:
      if (value < 0) {
        return 0xffffffffffffffd6;
      }
      CCtxParams->srcSizeHint = value;
      break;
    case ZSTD_c_experimentalParam8:
      CCtxParams->enableDedicatedDictSearch = (uint)(value != 0);
      return (ulong)(value != 0);
    case ZSTD_c_experimentalParam9:
      if (1 < (uint)value) {
        return 0xffffffffffffffd6;
      }
      CCtxParams->inBufferMode = value;
      break;
    case ZSTD_c_experimentalParam10:
      if (1 < (uint)value) {
        return 0xffffffffffffffd6;
      }
      CCtxParams->outBufferMode = value;
      break;
    case ZSTD_c_experimentalParam11:
      if (1 < (uint)value) {
        return 0xffffffffffffffd6;
      }
      CCtxParams->blockDelimiters = value;
      break;
    case ZSTD_c_experimentalParam12:
      if (1 < (uint)value) {
        return 0xffffffffffffffd6;
      }
      CCtxParams->validateSequences = value;
      break;
    case ZSTD_c_experimentalParam13:
      if (2 < (uint)value) {
        return 0xffffffffffffffd6;
      }
      CCtxParams->useBlockSplitter = value;
      break;
    case ZSTD_c_experimentalParam14:
      if (2 < (uint)value) {
        return 0xffffffffffffffd6;
      }
      CCtxParams->useRowMatchFinder = value;
      break;
    case ZSTD_c_experimentalParam15:
      if (1 < (uint)value) {
        return 0xffffffffffffffd6;
      }
      CCtxParams->deterministicRefPrefix = value;
      break;
    case ZSTD_c_experimentalParam16:
      if (2 < (uint)value) {
        return 0xffffffffffffffd6;
      }
      CCtxParams->prefetchCDictTables = value;
      break;
    case ZSTD_c_experimentalParam17:
      if (1 < (uint)value) {
        return 0xffffffffffffffd6;
      }
      CCtxParams->enableMatchFinderFallback = value;
      break;
    case ZSTD_c_experimentalParam18:
      if (value != 0 && value - 0x20001U < 0xfffe03ff) {
        return 0xffffffffffffffd6;
      }
      CCtxParams->maxBlockSize = (ulong)(uint)value;
      return (ulong)(uint)value;
    case ZSTD_c_experimentalParam19:
      if (2 < (uint)value) {
        return 0xffffffffffffffd6;
      }
      CCtxParams->searchForExternalRepcodes = value;
    }
  }
  sVar1 = (size_t)(uint)value;
switchD_018ad0ea_default:
  return sVar1;
}

Assistant:

size_t ZSTD_CCtxParams_setParameter(ZSTD_CCtx_params* CCtxParams,
                                    ZSTD_cParameter param, int value)
{
    DEBUGLOG(4, "ZSTD_CCtxParams_setParameter (%i, %i)", (int)param, value);
    switch(param)
    {
    case ZSTD_c_format :
        BOUNDCHECK(ZSTD_c_format, value);
        CCtxParams->format = (ZSTD_format_e)value;
        return (size_t)CCtxParams->format;

    case ZSTD_c_compressionLevel : {
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(param, &value), "");
        if (value == 0)
            CCtxParams->compressionLevel = ZSTD_CLEVEL_DEFAULT; /* 0 == default */
        else
            CCtxParams->compressionLevel = value;
        if (CCtxParams->compressionLevel >= 0) return (size_t)CCtxParams->compressionLevel;
        return 0;  /* return type (size_t) cannot represent negative values */
    }

    case ZSTD_c_windowLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_windowLog, value);
        CCtxParams->cParams.windowLog = (U32)value;
        return CCtxParams->cParams.windowLog;

    case ZSTD_c_hashLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_hashLog, value);
        CCtxParams->cParams.hashLog = (U32)value;
        return CCtxParams->cParams.hashLog;

    case ZSTD_c_chainLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_chainLog, value);
        CCtxParams->cParams.chainLog = (U32)value;
        return CCtxParams->cParams.chainLog;

    case ZSTD_c_searchLog :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_searchLog, value);
        CCtxParams->cParams.searchLog = (U32)value;
        return (size_t)value;

    case ZSTD_c_minMatch :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_minMatch, value);
        CCtxParams->cParams.minMatch = (U32)value;
        return CCtxParams->cParams.minMatch;

    case ZSTD_c_targetLength :
        BOUNDCHECK(ZSTD_c_targetLength, value);
        CCtxParams->cParams.targetLength = (U32)value;
        return CCtxParams->cParams.targetLength;

    case ZSTD_c_strategy :
        if (value!=0)   /* 0 => use default */
            BOUNDCHECK(ZSTD_c_strategy, value);
        CCtxParams->cParams.strategy = (ZSTD_strategy)value;
        return (size_t)CCtxParams->cParams.strategy;

    case ZSTD_c_contentSizeFlag :
        /* Content size written in frame header _when known_ (default:1) */
        DEBUGLOG(4, "set content size flag = %u", (value!=0));
        CCtxParams->fParams.contentSizeFlag = value != 0;
        return (size_t)CCtxParams->fParams.contentSizeFlag;

    case ZSTD_c_checksumFlag :
        /* A 32-bits content checksum will be calculated and written at end of frame (default:0) */
        CCtxParams->fParams.checksumFlag = value != 0;
        return (size_t)CCtxParams->fParams.checksumFlag;

    case ZSTD_c_dictIDFlag : /* When applicable, dictionary's dictID is provided in frame header (default:1) */
        DEBUGLOG(4, "set dictIDFlag = %u", (value!=0));
        CCtxParams->fParams.noDictIDFlag = !value;
        return !CCtxParams->fParams.noDictIDFlag;

    case ZSTD_c_forceMaxWindow :
        CCtxParams->forceWindow = (value != 0);
        return (size_t)CCtxParams->forceWindow;

    case ZSTD_c_forceAttachDict : {
        const ZSTD_dictAttachPref_e pref = (ZSTD_dictAttachPref_e)value;
        BOUNDCHECK(ZSTD_c_forceAttachDict, (int)pref);
        CCtxParams->attachDictPref = pref;
        return CCtxParams->attachDictPref;
    }

    case ZSTD_c_literalCompressionMode : {
        const ZSTD_paramSwitch_e lcm = (ZSTD_paramSwitch_e)value;
        BOUNDCHECK(ZSTD_c_literalCompressionMode, (int)lcm);
        CCtxParams->literalCompressionMode = lcm;
        return CCtxParams->literalCompressionMode;
    }

    case ZSTD_c_nbWorkers :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR_IF(value!=0, parameter_unsupported, "not compiled with multithreading");
        return 0;
#else
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(param, &value), "");
        CCtxParams->nbWorkers = value;
        return (size_t)(CCtxParams->nbWorkers);
#endif

    case ZSTD_c_jobSize :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR_IF(value!=0, parameter_unsupported, "not compiled with multithreading");
        return 0;
#else
        /* Adjust to the minimum non-default value. */
        if (value != 0 && value < ZSTDMT_JOBSIZE_MIN)
            value = ZSTDMT_JOBSIZE_MIN;
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(param, &value), "");
        assert(value >= 0);
        CCtxParams->jobSize = value;
        return CCtxParams->jobSize;
#endif

    case ZSTD_c_overlapLog :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR_IF(value!=0, parameter_unsupported, "not compiled with multithreading");
        return 0;
#else
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(ZSTD_c_overlapLog, &value), "");
        CCtxParams->overlapLog = value;
        return (size_t)CCtxParams->overlapLog;
#endif

    case ZSTD_c_rsyncable :
#ifndef ZSTD_MULTITHREAD
        RETURN_ERROR_IF(value!=0, parameter_unsupported, "not compiled with multithreading");
        return 0;
#else
        FORWARD_IF_ERROR(ZSTD_cParam_clampBounds(ZSTD_c_overlapLog, &value), "");
        CCtxParams->rsyncable = value;
        return (size_t)CCtxParams->rsyncable;
#endif

    case ZSTD_c_enableDedicatedDictSearch :
        CCtxParams->enableDedicatedDictSearch = (value!=0);
        return (size_t)CCtxParams->enableDedicatedDictSearch;

    case ZSTD_c_enableLongDistanceMatching :
        BOUNDCHECK(ZSTD_c_enableLongDistanceMatching, value);
        CCtxParams->ldmParams.enableLdm = (ZSTD_paramSwitch_e)value;
        return CCtxParams->ldmParams.enableLdm;

    case ZSTD_c_ldmHashLog :
        if (value!=0)   /* 0 ==> auto */
            BOUNDCHECK(ZSTD_c_ldmHashLog, value);
        CCtxParams->ldmParams.hashLog = (U32)value;
        return CCtxParams->ldmParams.hashLog;

    case ZSTD_c_ldmMinMatch :
        if (value!=0)   /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_ldmMinMatch, value);
        CCtxParams->ldmParams.minMatchLength = (U32)value;
        return CCtxParams->ldmParams.minMatchLength;

    case ZSTD_c_ldmBucketSizeLog :
        if (value!=0)   /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_ldmBucketSizeLog, value);
        CCtxParams->ldmParams.bucketSizeLog = (U32)value;
        return CCtxParams->ldmParams.bucketSizeLog;

    case ZSTD_c_ldmHashRateLog :
        if (value!=0)   /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_ldmHashRateLog, value);
        CCtxParams->ldmParams.hashRateLog = (U32)value;
        return CCtxParams->ldmParams.hashRateLog;

    case ZSTD_c_targetCBlockSize :
        if (value!=0) {  /* 0 ==> default */
            value = MAX(value, ZSTD_TARGETCBLOCKSIZE_MIN);
            BOUNDCHECK(ZSTD_c_targetCBlockSize, value);
        }
        CCtxParams->targetCBlockSize = (U32)value;
        return CCtxParams->targetCBlockSize;

    case ZSTD_c_srcSizeHint :
        if (value!=0)    /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_srcSizeHint, value);
        CCtxParams->srcSizeHint = value;
        return (size_t)CCtxParams->srcSizeHint;

    case ZSTD_c_stableInBuffer:
        BOUNDCHECK(ZSTD_c_stableInBuffer, value);
        CCtxParams->inBufferMode = (ZSTD_bufferMode_e)value;
        return CCtxParams->inBufferMode;

    case ZSTD_c_stableOutBuffer:
        BOUNDCHECK(ZSTD_c_stableOutBuffer, value);
        CCtxParams->outBufferMode = (ZSTD_bufferMode_e)value;
        return CCtxParams->outBufferMode;

    case ZSTD_c_blockDelimiters:
        BOUNDCHECK(ZSTD_c_blockDelimiters, value);
        CCtxParams->blockDelimiters = (ZSTD_sequenceFormat_e)value;
        return CCtxParams->blockDelimiters;

    case ZSTD_c_validateSequences:
        BOUNDCHECK(ZSTD_c_validateSequences, value);
        CCtxParams->validateSequences = value;
        return (size_t)CCtxParams->validateSequences;

    case ZSTD_c_useBlockSplitter:
        BOUNDCHECK(ZSTD_c_useBlockSplitter, value);
        CCtxParams->useBlockSplitter = (ZSTD_paramSwitch_e)value;
        return CCtxParams->useBlockSplitter;

    case ZSTD_c_useRowMatchFinder:
        BOUNDCHECK(ZSTD_c_useRowMatchFinder, value);
        CCtxParams->useRowMatchFinder = (ZSTD_paramSwitch_e)value;
        return CCtxParams->useRowMatchFinder;

    case ZSTD_c_deterministicRefPrefix:
        BOUNDCHECK(ZSTD_c_deterministicRefPrefix, value);
        CCtxParams->deterministicRefPrefix = !!value;
        return (size_t)CCtxParams->deterministicRefPrefix;

    case ZSTD_c_prefetchCDictTables:
        BOUNDCHECK(ZSTD_c_prefetchCDictTables, value);
        CCtxParams->prefetchCDictTables = (ZSTD_paramSwitch_e)value;
        return CCtxParams->prefetchCDictTables;

    case ZSTD_c_enableSeqProducerFallback:
        BOUNDCHECK(ZSTD_c_enableSeqProducerFallback, value);
        CCtxParams->enableMatchFinderFallback = value;
        return (size_t)CCtxParams->enableMatchFinderFallback;

    case ZSTD_c_maxBlockSize:
        if (value!=0)    /* 0 ==> default */
            BOUNDCHECK(ZSTD_c_maxBlockSize, value);
        CCtxParams->maxBlockSize = value;
        return CCtxParams->maxBlockSize;

    case ZSTD_c_searchForExternalRepcodes:
        BOUNDCHECK(ZSTD_c_searchForExternalRepcodes, value);
        CCtxParams->searchForExternalRepcodes = (ZSTD_paramSwitch_e)value;
        return CCtxParams->searchForExternalRepcodes;

    default: RETURN_ERROR(parameter_unsupported, "unknown parameter");
    }
}